

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory64Lowering.cpp
# Opt level: O2

void __thiscall
wasm::Memory64Lowering::visitDataSegment(Memory64Lowering *this,DataSegment *segment)

{
  Expression *pEVar1;
  Module *this_00;
  pointer puVar2;
  char *pcVar3;
  Type type;
  pointer puVar4;
  int64_t iVar5;
  Global *pGVar6;
  Builder curr;
  Const *pCVar7;
  Name base;
  Name name;
  undefined1 local_c0 [8];
  ImportInfo info;
  Builder builder;
  
  if (segment->isPassive == false) {
    pEVar1 = segment->offset;
    if (pEVar1->_id == GlobalGetId) {
      this_00 = (this->
                super_WalkerPass<wasm::PostWalker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>_>
                ).
                super_PostWalker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>
                .super_Walker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>.
                currModule;
      pGVar6 = Module::getGlobal(this_00,(Name)pEVar1[1]);
      if (((pGVar6->super_Importable).module.super_IString.str._M_str != (char *)0x0) &&
         ((pGVar6->super_Importable).base.super_IString.str._M_str == (char *)MEMORY_BASE._8_8_)) {
        ImportInfo::ImportInfo((ImportInfo *)local_c0,this_00);
        base.super_IString.str._M_str = (char *)DAT_00e639c8.id;
        base.super_IString.str._M_len = (size_t)MEMORY_BASE32;
        curr.wasm = (Module *)
                    ImportInfo::getImportedGlobal
                              ((ImportInfo *)local_c0,
                               (Name)(pGVar6->super_Importable).module.super_IString.str,base);
        type.id = DAT_00e639c8.id;
        puVar2 = MEMORY_BASE32;
        if (curr.wasm == (Module *)0x0) {
          info.importedTags.super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)this_00;
          pCVar7 = Builder::makeConst<int>
                             ((Builder *)
                              &info.importedTags.
                               super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>._M_impl
                               .super__Vector_impl_data._M_end_of_storage,0);
          name.super_IString.str._M_str = (char *)puVar2;
          name.super_IString.str._M_len = (size_t)&builder;
          Builder::makeGlobal(name,type,(Expression *)0x2,(Mutability)pCVar7);
          curr = builder;
          builder.wasm = (Module *)0x0;
          std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::~unique_ptr
                    ((unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)&builder);
          puVar2 = (pointer)(pGVar6->super_Importable).module.super_IString.str._M_str;
          ((curr.wasm)->functions).
          super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)(pGVar6->super_Importable).module.super_IString.str._M_len;
          ((curr.wasm)->functions).
          super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = puVar2;
          puVar4 = (pointer)DAT_00e639c8.id;
          ((curr.wasm)->functions).
          super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = MEMORY_BASE32;
          ((curr.wasm)->globals).
          super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = puVar4;
          Module::addGlobal(this_00,(Global *)curr.wasm);
        }
        (pEVar1->type).id = 2;
        pcVar3 = (((Importable *)&(curr.wasm)->exports)->super_Named).name.super_IString.str._M_str;
        *(size_t *)(pEVar1 + 1) =
             (((Importable *)&(curr.wasm)->exports)->super_Named).name.super_IString.str._M_len;
        pEVar1[1].type.id = (uintptr_t)pcVar3;
        ImportInfo::~ImportInfo((ImportInfo *)local_c0);
      }
    }
    else if (pEVar1->_id == ConstId) {
      iVar5 = Literal::geti64((Literal *)(pEVar1 + 1));
      local_c0._0_4_ = (undefined4)iVar5;
      info.importedGlobals.super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x2;
      Literal::operator=((Literal *)(pEVar1 + 1),(Literal *)local_c0);
      Literal::~Literal((Literal *)local_c0);
      (pEVar1->type).id = 2;
    }
  }
  return;
}

Assistant:

void visitDataSegment(DataSegment* segment) {
    if (!segment->isPassive) {
      if (auto* c = segment->offset->dynCast<Const>()) {
        c->value = Literal(static_cast<uint32_t>(c->value.geti64()));
        c->type = Type::i32;
      } else if (auto* get = segment->offset->dynCast<GlobalGet>()) {
        auto& module = *getModule();
        auto* g = module.getGlobal(get->name);
        if (g->imported() && g->base == MEMORY_BASE) {
          ImportInfo info(module);
          auto* memoryBase32 = info.getImportedGlobal(g->module, MEMORY_BASE32);
          if (!memoryBase32) {
            Builder builder(module);
            memoryBase32 = builder
                             .makeGlobal(MEMORY_BASE32,
                                         Type::i32,
                                         builder.makeConst(int32_t(0)),
                                         Builder::Immutable)
                             .release();
            memoryBase32->module = g->module;
            memoryBase32->base = MEMORY_BASE32;
            module.addGlobal(memoryBase32);
          }
          // Use this alternative import when initializing the segment.
          assert(memoryBase32);
          get->type = Type::i32;
          get->name = memoryBase32->name;
        }
      }
    }
  }